

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

int response_determination(CManager cm,stone_type stone,action_class stage,event_item *event)

{
  FMFormat *pp_Var1;
  action_value aVar2;
  EVstone EVar3;
  _proto_action *p_Var4;
  CMConnection_conflict p_Var5;
  FMFormat *pp_Var6;
  extern_routines p_Var7;
  int iVar8;
  uint uVar9;
  FMFormat *pp_Var10;
  char *pcVar11;
  char *pcVar12;
  FMStructDescList p_Var13;
  long *plVar14;
  size_t sVar15;
  response_cache_element *prVar16;
  FMFormat p_Var17;
  undefined8 *puVar18;
  cod_parse_context ppVar19;
  _event_path_data *p_Var20;
  extern_routines p_Var21;
  void *pvVar22;
  code *func;
  undefined8 uVar23;
  FMFormat *pp_Var24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  FMcompat_formats older_format;
  FMFormat local_90;
  undefined8 *local_88;
  void *local_78;
  undefined8 local_38;
  
  local_38 = 0;
  local_88 = (undefined8 *)INT_CMmalloc((long)stone->proto_action_count * 8 + 8);
  local_78 = INT_CMmalloc((long)stone->proto_action_count * 4 + 4);
  if (stone->proto_action_count < 1) {
    *local_88 = 0;
    p_Var17 = event->reference_format;
    local_90 = (FMFormat)0x0;
    if (p_Var17 != (FMFormat)0x0) goto LAB_00136d1c;
LAB_00136d49:
    if (stone->proto_action_count < 1) {
      iVar29 = -1;
    }
    else {
      uVar30 = 0xffffffff;
      lVar25 = 0;
      uVar27 = 0;
      do {
        iVar8 = proto_action_in_stage
                          ((proto_action *)((long)&stone->proto_actions->action_type + lVar25),stage
                          );
        if (iVar8 != 0) {
          p_Var4 = stone->proto_actions;
          plVar14 = *(long **)((long)&p_Var4->matching_reference_formats + lVar25);
          if (((plVar14 == (long *)0x0) || (*plVar14 == 0)) &&
             (*(int *)((long)&p_Var4->data_state + lVar25) != 1)) {
            uVar30 = uVar27 & 0xffffffff;
          }
          if ((*(int *)((long)&p_Var4->action_type + lVar25) == 6) &&
             (*(int *)(*(long *)((long)&p_Var4->o + lVar25) + 0x20) != 0)) {
            uVar30 = uVar27 & 0xffffffff;
          }
        }
        iVar29 = (int)uVar30;
        uVar27 = uVar27 + 1;
        lVar25 = lVar25 + 0x60;
      } while ((long)uVar27 < (long)stone->proto_action_count);
    }
  }
  else {
    lVar25 = 0;
    local_90 = (FMFormat)0x0;
    do {
      iVar8 = proto_action_in_stage(stone->proto_actions + lVar25,stage);
      if ((iVar8 != 0) &&
         (pp_Var10 = stone->proto_actions[lVar25].matching_reference_formats,
         pp_Var10 != (FMFormat *)0x0)) {
        lVar26 = 0;
        do {
          if (*(long *)((long)pp_Var10 + lVar26) == 0) break;
          pcVar11 = (char *)name_of_FMformat(event->reference_format);
          pcVar12 = (char *)name_of_FMformat(*(undefined8 *)
                                              ((long)stone->proto_actions[lVar25].
                                                     matching_reference_formats + lVar26));
          iVar8 = strcmp(pcVar11,pcVar12);
          if (iVar8 == 0) {
            lVar28 = (long)(int)local_90;
            local_88 = (undefined8 *)INT_CMrealloc(local_88,lVar28 * 8 + 0x10);
            local_78 = INT_CMrealloc(local_78,lVar28 * 4 + 8);
            local_88[lVar28] =
                 *(undefined8 *)
                  ((long)stone->proto_actions[lVar25].matching_reference_formats + lVar26);
            *(int *)((long)local_78 + lVar28 * 4) = (int)lVar25;
            local_90 = (FMFormat)(ulong)((int)local_90 + 1);
          }
          pp_Var10 = stone->proto_actions[lVar25].matching_reference_formats;
          lVar26 = lVar26 + 8;
        } while (pp_Var10 != (FMFormat *)0x0);
      }
      lVar25 = lVar25 + 1;
      iVar8 = stone->proto_action_count;
    } while (lVar25 < iVar8);
    local_88[(int)local_90] = 0;
    p_Var17 = event->reference_format;
    if (p_Var17 == (FMFormat)0x0) {
      if (iVar8 < 1) {
LAB_00136d47:
        local_90 = (FMFormat)0x0;
        goto LAB_00136d49;
      }
      uVar30 = 0xffffffff;
      local_90 = (FMFormat)0x0;
      lVar25 = 0;
      uVar27 = 0;
      do {
        iVar8 = proto_action_in_stage
                          ((proto_action *)((long)&stone->proto_actions->action_type + lVar25),stage
                          );
        if ((iVar8 != 0) &&
           ((plVar14 = *(long **)((long)&stone->proto_actions->matching_reference_formats + lVar25),
            plVar14 == (long *)0x0 || (*plVar14 == 0)))) {
          uVar30 = uVar27 & 0xffffffff;
        }
        iVar29 = (int)uVar30;
        uVar27 = uVar27 + 1;
        lVar25 = lVar25 + 0x60;
      } while ((long)uVar27 < (long)stone->proto_action_count);
    }
    else {
LAB_00136d1c:
      iVar8 = FMformat_compat_cmp2(p_Var17,local_88,local_90,&local_38);
      if (iVar8 == -1) goto LAB_00136d47;
      iVar29 = *(int *)((long)local_78 + (long)iVar8 * 4);
      local_90 = (FMFormat)local_88[iVar8];
    }
    if (iVar29 == -1) goto LAB_00136d49;
  }
  pp_Var10 = &event->reference_format;
  free(local_88);
  free(local_78);
  if (iVar29 == -1) {
    iVar8 = 0;
    goto LAB_001377f2;
  }
  p_Var4 = stone->proto_actions;
  aVar2 = p_Var4[iVar29].action_type;
  if ((aVar2 == Action_Congestion) || (aVar2 == Action_Multi)) {
    pp_Var6 = p_Var4[iVar29].matching_reference_formats;
    p_Var5 = p_Var4[iVar29].o.bri.conn;
    puVar18 = (undefined8 *)INT_CMmalloc(0x40);
    ppVar19 = (cod_parse_context)new_cod_parse_context();
    *puVar18 = 0;
    puVar18[1] = 0;
    puVar18[2] = 0;
    puVar18[3] = 0;
    puVar18[4] = 0;
    puVar18[5] = 0;
    puVar18[6] = 0;
    puVar18[7] = 0;
    if (*pp_Var6 == (FMFormat)0x0) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      pp_Var24 = pp_Var6;
      do {
        plVar14 = (long *)format_list_of_FMFormat();
        lVar25 = *plVar14;
        while (lVar25 != 0) {
          cod_add_simple_struct_type(lVar25,plVar14[1],ppVar19);
          lVar25 = plVar14[4];
          plVar14 = plVar14 + 4;
        }
        iVar8 = iVar8 + 1;
        pp_Var1 = pp_Var24 + 1;
        pp_Var24 = pp_Var24 + 1;
      } while (*pp_Var1 != (FMFormat)0x0);
    }
    add_standard_routines(stone,ppVar19);
    add_metrics_routines(stone,ppVar19);
    add_queued_routines_externs._8_8_ = cod_ev_conforms;
    add_queued_routines_externs._24_8_ = cod_ev_discard_rel;
    add_queued_routines_externs._40_8_ = cod_ev_discard_rel;
    add_queued_routines_externs._56_8_ = cod_ev_discard_and_submit_rel;
    add_queued_routines_externs._72_8_ = cod_ev_discard_and_submit_rel;
    add_queued_routines_externs._88_8_ = cod_ev_get_data_rel;
    add_queued_routines_externs._104_8_ = cod_ev_get_data_rel;
    add_queued_routines_externs._120_8_ = cod_ev_count;
    add_queued_routines_externs._136_8_ = cod_ev_count;
    add_queued_routines_externs._152_8_ = cod_ev_present;
    add_queued_routines_externs._168_8_ = cod_ev_get_port;
    add_queued_routines_externs._184_8_ = cod_ev_target_size;
    add_queued_routines_externs._200_8_ = cod_ev_get_attrs;
    add_queued_routines_externs._216_8_ = cod_ev_get_attrs;
    cod_assoc_externs(ppVar19,add_queued_routines_externs);
    cod_parse_for_context(add_queued_routines_extern_string,ppVar19);
    cod_set_closure("EVdiscard_full",0xffffffffffffffff,ppVar19);
    cod_set_closure("EVdiscard_and_submit_full",0xffffffffffffffff,ppVar19);
    cod_set_closure("EVget_attrs_full",0xffffffffffffffff,ppVar19);
    cod_set_closure("EVdata_full",0xffffffffffffffff,ppVar19);
    cod_set_closure("EVcount_full",0xffffffffffffffff,ppVar19);
    if (*pp_Var6 != (FMFormat)0x0) {
      lVar25 = 0;
      do {
        pcVar11 = (char *)name_of_FMformat();
        add_typed_queued_routines(ppVar19,(int)lVar25,pcVar11);
        lVar26 = lVar25 + 1;
        lVar25 = lVar25 + 1;
      } while (pp_Var6[lVar26] != (FMFormat)0x0);
    }
    add_typed_queued_routines(ppVar19,-2,"anonymous");
    if (*pp_Var6 != (FMFormat)0x0) {
      uVar27 = 0;
      do {
        pcVar11 = (char *)name_of_FMformat();
        sVar15 = strlen(pcVar11);
        pcVar12 = (char *)INT_CMmalloc(sVar15 + 4);
        sprintf(pcVar12,"%s_ID",pcVar11);
        cod_add_int_constant_to_parse_context(pcVar12,uVar27 & 0xffffffff,ppVar19);
        free(pcVar12);
        lVar25 = uVar27 + 1;
        uVar27 = uVar27 + 1;
      } while (pp_Var6[lVar25] != (FMFormat)0x0);
    }
    p_Var20 = cm->evp;
    if ((p_Var20->extern_structs != (FMStructDescList *)0x0) &&
       (p_Var13 = *p_Var20->extern_structs, p_Var13 != (FMStructDescList)0x0)) {
      lVar25 = 8;
      do {
        cod_add_struct_type(p_Var13,ppVar19);
        p_Var20 = cm->evp;
        p_Var13 = *(FMStructDescList *)((long)p_Var20->extern_structs + lVar25);
        lVar25 = lVar25 + 8;
      } while (p_Var13 != (FMStructDescList)0x0);
    }
    p_Var21 = p_Var20->externs;
    if ((p_Var21 != (extern_routines)0x0) && (p_Var21->extern_decl != (char *)0x0)) {
      lVar25 = 0x10;
      do {
        cod_assoc_externs(ppVar19,p_Var21->externs);
        cod_parse_for_context
                  (*(undefined8 *)((long)&cm->evp->externs[-1].extern_decl + lVar25),ppVar19);
        p_Var7 = cm->evp->externs;
        p_Var21 = (extern_routines)((long)&p_Var7->extern_decl + lVar25);
        plVar14 = (long *)((long)&p_Var7->extern_decl + lVar25);
        lVar25 = lVar25 + 0x10;
      } while (*plVar14 != 0);
    }
    if (*(int *)&p_Var5->cm != 3) {
      __assert_fail("mrd->response_type == Response_Multityped",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x92f,
                    "response_instance generate_multityped_code(CManager, struct response_spec *, stone_type, FMFormat *)"
                   );
    }
    cod_add_param("ec","cod_exec_context",0,ppVar19);
    cod_set_return_type("void",ppVar19);
    lVar25 = cod_code_gen(p_Var5->transport_data,ppVar19);
    *(undefined4 *)puVar18 = *(undefined4 *)&p_Var5->cm;
    *(int *)(puVar18 + 2) = iVar8;
    puVar18[6] = pp_Var6;
    puVar18[3] = lVar25;
    if (lVar25 != 0) {
      uVar23 = cod_create_exec_context(lVar25);
      puVar18[4] = uVar23;
    }
    cod_free_parse_context(ppVar19);
    if (puVar18[4] == 0) {
      free(puVar18);
      return 0;
    }
    EVar3 = stone->local_id;
    *(EVstone *)((long)puVar18 + 4) = EVar3;
    *(int *)(puVar18 + 1) = iVar29;
    INT_EVassoc_mutated_multi_action
              (cm,EVar3,iVar29,queued_wrapper,puVar18,p_Var4[iVar29].matching_reference_formats,
               free_multi_response);
    if ((*(int *)&p_Var5->io_out_buffer != 0) && (local_90 == (FMFormat)0x0)) {
      INT_EVassoc_anon_multi_action(cm,stone->local_id,iVar29,queued_wrapper,puVar18,*pp_Var10);
    }
    if (event->event_encoded == 0) {
      iVar8 = 1;
      goto LAB_001377f2;
    }
  }
  else if (aVar2 == Action_Immediate) {
    p_Var5 = p_Var4[iVar29].o.bri.conn;
    switch(*(undefined4 *)&p_Var5->cm) {
    case 0:
    case 2:
      local_90 = event->reference_format;
      if (event->event_encoded != 0) {
        p_Var13 = (FMStructDescList)get_localized_formats();
        local_90 = EVregister_format_set(cm,p_Var13);
        free_struct_list(p_Var13);
      }
      break;
    case 1:
      local_90 = *(FMFormat *)&p_Var5->closed;
      break;
    case 3:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x523,
                    "int response_determination(CManager, stone_type, action_class, event_item *)");
    default:
      local_90 = (FMFormat)0x0;
    }
    puVar18 = (undefined8 *)INT_CMmalloc(0x40);
    ppVar19 = (cod_parse_context)new_cod_parse_context();
    *puVar18 = 0;
    puVar18[1] = 0;
    puVar18[2] = 0;
    puVar18[3] = 0;
    puVar18[4] = 0;
    puVar18[5] = 0;
    puVar18[6] = 0;
    puVar18[7] = 0;
    add_standard_routines(stone,ppVar19);
    add_metrics_routines(stone,ppVar19);
    p_Var20 = cm->evp;
    if ((p_Var20->extern_structs != (FMStructDescList *)0x0) &&
       (p_Var13 = *p_Var20->extern_structs, p_Var13 != (FMStructDescList)0x0)) {
      lVar25 = 8;
      do {
        cod_add_struct_type(p_Var13,ppVar19);
        p_Var20 = cm->evp;
        p_Var13 = *(FMStructDescList *)((long)p_Var20->extern_structs + lVar25);
        lVar25 = lVar25 + 8;
      } while (p_Var13 != (FMStructDescList)0x0);
    }
    p_Var21 = p_Var20->externs;
    if ((p_Var21 != (extern_routines)0x0) && (p_Var21->extern_decl != (char *)0x0)) {
      lVar25 = 0x10;
      do {
        cod_assoc_externs(ppVar19,p_Var21->externs);
        cod_parse_for_context
                  (*(undefined8 *)((long)&cm->evp->externs[-1].extern_decl + lVar25),ppVar19);
        p_Var7 = cm->evp->externs;
        p_Var21 = (extern_routines)((long)&p_Var7->extern_decl + lVar25);
        plVar14 = (long *)((long)&p_Var7->extern_decl + lVar25);
        lVar25 = lVar25 + 0x10;
      } while (*plVar14 != 0);
    }
    uVar9 = *(uint *)&p_Var5->cm;
    if (uVar9 < 3) {
      cod_add_param("ec","cod_exec_context",0,ppVar19);
      if (local_90 == (FMFormat)0x0) {
        cod_add_param("input","int",1,ppVar19);
      }
      else {
        add_param(ppVar19,"input",1,local_90);
      }
      if (*(int *)&p_Var5->cm == 1) {
        add_param(ppVar19,"output",2,(FMFormat)p_Var5->preloaded_formats);
        cod_add_param("event_attrs","attr_list",3,ppVar19);
        pcVar11 = "output_attrs";
        uVar23 = 4;
      }
      else {
        pcVar11 = "event_attrs";
        uVar23 = 2;
      }
      cod_add_param(pcVar11,"attr_list",uVar23,ppVar19);
      uVar9 = *(uint *)&p_Var5->cm;
    }
    else if (uVar9 == 3) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x879,
                    "response_instance generate_filter_code(CManager, struct response_spec *, stone_type, FMFormat)"
                   );
    }
    if (uVar9 == 2) {
LAB_00137560:
      pcVar11 = (char *)p_Var5->transport_data;
      if (((*pcVar11 == 'd') && (pcVar11[1] == 'l')) && ((pcVar11[2] == 'l' && (pcVar11[3] == ':')))
         ) {
        pcVar11 = extract_dll_path(pcVar11);
        pcVar12 = extract_symbol_name((char *)p_Var5->transport_data);
        if ((pcVar11 == (char *)0x0) || (pcVar12 == (char *)0x0)) {
          response_determination_cold_3();
          return 0;
        }
        pvVar22 = load_dll_symbol((CManager)cm->CMTrace_file,pcVar11,pcVar12);
        puVar18[2] = pvVar22;
        if (pvVar22 == (void *)0x0) {
          response_determination_cold_4();
          return 0;
        }
        free(pcVar12);
        free(pcVar11);
        puVar18[3] = 0;
      }
      else {
        lVar25 = cod_code_gen(pcVar11,ppVar19);
        *(undefined4 *)puVar18 = *(undefined4 *)&p_Var5->cm;
        puVar18[3] = lVar25;
        if (lVar25 != 0) {
          uVar23 = cod_create_exec_context(lVar25);
          puVar18[4] = uVar23;
        }
        puVar18[2] = 0;
      }
LAB_0013770c:
      cod_free_parse_context(ppVar19);
    }
    else {
      if (uVar9 == 1) {
        pcVar11 = *(char **)&p_Var5->conn_ref_count;
        if ((((*pcVar11 == 'd') && (pcVar11[1] == 'l')) && (pcVar11[2] == 'l')) &&
           (pcVar11[3] == ':')) {
          pcVar11 = extract_dll_path(pcVar11);
          pcVar12 = extract_symbol_name(*(char **)&p_Var5->conn_ref_count);
          if ((pcVar11 == (char *)0x0) || (pcVar12 == (char *)0x0)) {
            response_determination_cold_1();
            return 0;
          }
          pvVar22 = load_dll_symbol((CManager)cm->CMTrace_file,pcVar11,pcVar12);
          puVar18[2] = pvVar22;
          if (pvVar22 == (void *)0x0) {
            response_determination_cold_2();
            return 0;
          }
          puVar18[3] = 0;
          free(pcVar11);
          free(pcVar12);
        }
        else {
          lVar25 = cod_code_gen(pcVar11,ppVar19);
          *(undefined4 *)puVar18 = 1;
          puVar18[3] = lVar25;
          if (lVar25 != 0) {
            uVar23 = cod_create_exec_context(lVar25);
            puVar18[4] = uVar23;
          }
        }
        *(int *)(puVar18 + 5) = p_Var5->handshake_condition;
        puVar18[7] = p_Var5->preloaded_formats;
        goto LAB_0013770c;
      }
      if (uVar9 == 0) goto LAB_00137560;
      cod_free_parse_context(ppVar19);
      if (puVar18 == (undefined8 *)0x0) {
        return 0;
      }
    }
    EVar3 = stone->local_id;
    *(EVstone *)((long)puVar18 + 4) = EVar3;
    *(int *)(puVar18 + 1) = iVar29;
    iVar8 = *(int *)&p_Var5->cm;
    if (iVar8 == 0) {
      INT_EVassoc_mutated_imm_action
                (cm,EVar3,iVar29,filter_wrapper,puVar18,local_90,free_imm_response);
    }
    else {
      if (iVar8 == 1) {
        func = transform_wrapper;
      }
      else {
        if (iVar8 != 2) {
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                        ,0x53d,
                        "int response_determination(CManager, stone_type, action_class, event_item *)"
                       );
        }
        func = router_wrapper;
      }
      INT_EVassoc_mutated_imm_action(cm,EVar3,iVar29,func,puVar18,local_90,free_imm_response);
    }
  }
  else {
    if (p_Var4[iVar29].matching_reference_formats == (FMFormat *)0x0) {
      local_90 = (FMFormat)0x0;
    }
    else {
      local_90 = *p_Var4[iVar29].matching_reference_formats;
    }
    prVar16 = stone->response_cache;
    if ((long)stone->response_cache_count == 0) {
      if (prVar16 != (response_cache_element *)0x0) {
        free(prVar16);
      }
      prVar16 = (response_cache_element *)INT_CMmalloc(0x30);
    }
    else {
      prVar16 = (response_cache_element *)
                INT_CMrealloc(prVar16,(long)stone->response_cache_count * 0x30 + 0x30);
    }
    stone->response_cache = prVar16;
    iVar8 = stone->response_cache_count;
    stone->response_cache_count = iVar8 + 1;
    prVar16 = prVar16 + iVar8;
    p_Var4 = stone->proto_actions;
    p_Var17 = local_90;
    if (local_90 == (FMFormat)0x0) {
      p_Var17 = *pp_Var10;
    }
    prVar16->reference_format = p_Var17;
    prVar16->proto_action_id = iVar29;
    prVar16->action_type = p_Var4[iVar29].action_type;
    prVar16->requires_decoded = (uint)(p_Var4[iVar29].data_state == Requires_Decoded);
    prVar16->stage = stage;
  }
  iVar8 = 1;
  if (local_90 != (FMFormat)0x0) {
    if (event->event_encoded == 0) {
      p_Var17 = *pp_Var10;
      if (p_Var17 == local_90) goto LAB_001377f2;
      iVar29 = stone->local_id;
    }
    else {
      iVar29 = stone->local_id;
      p_Var17 = *pp_Var10;
    }
    INT_EVassoc_conversion_action(cm,iVar29,stage,local_90,p_Var17);
  }
LAB_001377f2:
  fix_response_cache(stone);
  return iVar8;
}

Assistant:

int
response_determination(CManager cm, stone_type stone, action_class stage, event_item *event)
{
    int nearest_proto_action = -1;
    int return_value = 0;
    FMFormat conversion_target_format = NULL;
    FMFormat matching_format = NULL;
    int i, format_count = 0;
    FMFormat * formatList;
    int *format_map;
    FMcompat_formats older_format = NULL;

    formatList =
	(FMFormat *) malloc((stone->proto_action_count + 1) * sizeof(FMFormat));
    format_map = (int *) malloc((stone->proto_action_count + 1) * sizeof(int));
    for (i = 0; i < stone->proto_action_count; i++) {
	int j = 0;
        if (!proto_action_in_stage(&stone->proto_actions[i], stage)) {
            continue;
        }
	while (stone->proto_actions[i].matching_reference_formats &&
	       (stone->proto_actions[i].matching_reference_formats[j] != NULL)) {
	    if (strcmp(name_of_FMformat(event->reference_format), name_of_FMformat(stone->proto_actions[i].matching_reference_formats[j])) == 0 ) {
		formatList = (FMFormat *) realloc(formatList, (format_count + 2) * sizeof(FMFormat));
		format_map = realloc(format_map, (format_count + 2) * sizeof(int));
		formatList[format_count] = stone->proto_actions[i].matching_reference_formats[j];
		format_map[format_count] = i;
		format_count++;
	    }
	    j++;
	}
    }
    formatList[format_count] = NULL;
    if (event->reference_format == NULL) {
	/* special case for unformatted input */
	for (i=0 ; i < stone->proto_action_count ; i++) {
            if (!proto_action_in_stage(&stone->proto_actions[i], stage))
		continue;
	    if ((stone->proto_actions[i].matching_reference_formats == NULL) ||
		(stone->proto_actions[i].matching_reference_formats[0] == NULL))
		nearest_proto_action = i;
	}
    } else {
	int map_entry = FMformat_compat_cmp2(event->reference_format,
						    formatList,
						    format_count,
						    &older_format);
	if (map_entry != -1) {
            nearest_proto_action = format_map[map_entry];
            matching_format = formatList[map_entry];
        }
    }
    if (nearest_proto_action == -1) {
        /* special case for accepting anything */
        for (i=0; i < stone->proto_action_count; i++) {
            if (!proto_action_in_stage(&stone->proto_actions[i], stage)) continue;
            if (((stone->proto_actions[i].matching_reference_formats == NULL) ||
		 (stone->proto_actions[i].matching_reference_formats[0] == NULL))
                && stone->proto_actions[i].data_state != Requires_Decoded) {
                nearest_proto_action = i;
            }
            if (stone->proto_actions[i].action_type == Action_Multi) {
		struct response_spec *mrd;

		mrd =
		    stone->proto_actions[i].o.imm.mutable_response_data;
		if (mrd->u.multityped.accept_anonymous) {
		    nearest_proto_action = i;
		}
            }
        }
    }
    free(formatList);
    free(format_map);
    if (nearest_proto_action != -1) {
	int action_generated = 0;
	proto_action *proto = &stone->proto_actions[nearest_proto_action];
	if (proto->action_type == Action_Immediate) {
	    /* must be immediate action */
	    response_instance instance;
	    struct response_spec *mrd;
	    mrd =
		proto->o.imm.mutable_response_data;
	    switch(mrd->response_type) {
	    case Response_Filter:
	    case Response_Router:
		if (event->event_encoded) {
		    conversion_target_format =
			localize_format(cm, event->reference_format);
		} else {
		    conversion_target_format = event->reference_format;
		}
		break;
	    case Response_Transform:
		conversion_target_format = mrd->u.transform.reference_input_format;
		break;
	    case Response_Multityped:
		assert(FALSE);
                break;
	    }

	    instance = generate_filter_code(cm, mrd, stone, conversion_target_format);
	    if (instance == NULL) return 0;
	    instance->stone = stone->local_id;
	    instance->proto_action_id = nearest_proto_action;
	    action_generated++;
	    switch(mrd->response_type) {
	    case Response_Filter:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       filter_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
	    case Response_Router:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       router_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
	    case Response_Transform:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       transform_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
            default:
		assert(FALSE);
		break;
	    }
	    return_value = 1;
	} else 	if (proto->action_type == Action_Multi || proto->action_type == Action_Congestion) {
	    response_instance instance;
	    struct response_spec *mrd;

	    mrd =
		proto->o.imm.mutable_response_data;
	    instance = generate_multityped_code(cm, mrd, stone,
						 proto->matching_reference_formats);
	    if (instance == 0) {
                return 0;
            }
	    instance->stone = stone->local_id;
	    instance->proto_action_id = nearest_proto_action;
	    action_generated++;
	    INT_EVassoc_mutated_multi_action(cm, stone->local_id, nearest_proto_action,
					     queued_wrapper, instance,
					     proto->matching_reference_formats, free_multi_response);
	    if (mrd->u.multityped.accept_anonymous && (matching_format == NULL)) {
		/* we're accepting this as an anonymous target */
		INT_EVassoc_anon_multi_action(cm, stone->local_id, nearest_proto_action, queued_wrapper, instance,
					      event->reference_format);
	    }
            if (event->event_encoded) {
                conversion_target_format = matching_format;
            }
            return_value = 1;
	} else {
	    response_cache_element *resp;

	    conversion_target_format = NULL;
	    if (proto->matching_reference_formats) {
		conversion_target_format = proto->matching_reference_formats[0];
	    }

	    /* we'll install the conversion later, first map the response */
	    if (stone->response_cache_count == 0) {
		if (stone->response_cache != NULL) free(stone->response_cache);
		stone->response_cache = malloc(sizeof(stone->response_cache[0]));
	    } else {
		stone->response_cache =
		    realloc(stone->response_cache,
			    (stone->response_cache_count + 1) * sizeof(stone->response_cache[0]));
	    }
	    resp = &stone->response_cache[stone->response_cache_count++];
	    proto_action *proto2 = &stone->proto_actions[nearest_proto_action];
	    if (conversion_target_format) {
		resp->reference_format = conversion_target_format;
	    } else {
		resp->reference_format = event->reference_format;
	    }
	    resp->proto_action_id = nearest_proto_action;
	    resp->action_type = proto2->action_type;
	    resp->requires_decoded = (proto2->data_state == Requires_Decoded);
            resp->stage = stage;
	}
	if (conversion_target_format != NULL) {
	    if (event->event_encoded) {
		/* create a decode action */
		INT_EVassoc_conversion_action(cm, stone->local_id, stage,
					      conversion_target_format,
					      event->reference_format);
		return_value = 1;
	    } else {
		if (event->reference_format != conversion_target_format) {
		    /* 
		     * create a decode action anyway, the event will be
		     * encoded to a buffer and then decoded into the target
		     * format.  Doing this more efficiently is difficult. 
		     */
		    INT_EVassoc_conversion_action(cm, stone->local_id, stage,
						  conversion_target_format,
						  event->reference_format);
		    return_value = 1;
		} else {
		    return_value = 1;
		}
	    }
	} else {
            return_value = 1;
        }
    }
    fix_response_cache(stone);
    return return_value;
}